

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyzer.cpp
# Opt level: O2

void __thiscall
SemanticAnalyzerRun::pushScope
          (SemanticAnalyzerRun *this,bool newFn,
          vector<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_> *itemsToDeclare)

{
  __shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  Scope *this_00;
  element_type *variableName;
  bool *errorMessage;
  shared_ptr<Scope> *this_01;
  shared_ptr<Token> *item;
  __shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2> *token;
  undefined1 local_a8 [8];
  optional<VariableDefinition> find;
  undefined1 local_68 [8];
  shared_ptr<Scope> newScope;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  shared_ptr<Scope> *local_48;
  SemanticAnalyzerRun *local_40;
  undefined1 local_32;
  allocator<char> local_31 [7];
  bool newFn_local;
  
  this_01 = &this->currentScope;
  local_40 = this;
  local_32 = newFn;
  std::make_shared<Scope,bool&,std::shared_ptr<Scope>&>
            ((bool *)local_68,(shared_ptr<Scope> *)&local_32);
  std::__shared_ptr<Scope,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&this_01->super___shared_ptr<Scope,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<Scope,_(__gnu_cxx::_Lock_policy)2> *)local_68);
  p_Var1 = &((itemsToDeclare->
             super__Vector_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>).
             _M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>;
  local_48 = this_01;
  for (token = &((itemsToDeclare->
                 super__Vector_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>
                 )._M_impl.super__Vector_impl_data._M_start)->
                super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>;
      errorMessage = &find.super__Optional_base<VariableDefinition,_false,_false>._M_payload.
                      super__Optional_payload<VariableDefinition,_true,_false,_false>.
                      super__Optional_payload_base<VariableDefinition>._M_engaged, token != p_Var1;
      token = token + 1) {
    Scope::findLocally((optional<VariableDefinition> *)local_a8,
                       (this_01->super___shared_ptr<Scope,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                       &token->_M_ptr->value,false);
    if (find.super__Optional_base<VariableDefinition,_false,_false>._M_payload.
        super__Optional_payload<VariableDefinition,_true,_false,_false>.
        super__Optional_payload_base<VariableDefinition>._M_payload._M_value.isFullyBound == true) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)errorMessage,"Duplicate identifier found within the same scope.",local_31
                );
      reportError(local_40,(shared_ptr<Token> *)token,(string *)errorMessage);
      std::__cxx11::string::~string((string *)errorMessage);
    }
    else {
      this_00 = (this_01->super___shared_ptr<Scope,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      variableName = token->_M_ptr;
      std::__shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2> *)
                 &newScope.super___shared_ptr<Scope,_(__gnu_cxx::_Lock_policy)2>._M_refcount,token);
      this_01 = local_48;
      Scope::define(this_00,&variableName->value,
                    (shared_ptr<Token> *)
                    &newScope.super___shared_ptr<Scope,_(__gnu_cxx::_Lock_policy)2>._M_refcount,true
                   );
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
    }
    std::_Optional_payload_base<VariableDefinition>::_M_reset
              ((_Optional_payload_base<VariableDefinition> *)local_a8);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&newScope);
  return;
}

Assistant:

void pushScope(bool newFn, const std::vector<std::shared_ptr<Token>>& itemsToDeclare) noexcept {
    auto newScope = std::make_shared<Scope>(newFn, this->currentScope);
    this->currentScope = newScope;

    for (auto& item : itemsToDeclare) {
      auto find = this->currentScope->findLocally(item->value, false);

      if (find) {
        this->reportError(item, "Duplicate identifier found within the same scope.");

      } else {
        this->currentScope->define(item->value, item, true);
      }
    }
  }